

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

XmlWriter * __thiscall Catch::XmlWriter::operator=(XmlWriter *this,XmlWriter *other)

{
  XmlWriter temp;
  XmlWriter XStack_58;
  
  XmlWriter(&XStack_58,other);
  swap(this,&XStack_58);
  ~XmlWriter(&XStack_58);
  return this;
}

Assistant:

XmlWriter& operator = ( XmlWriter const& other ) {
            XmlWriter temp( other );
            swap( temp );
            return *this;
        }